

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

int secp256k1_ecmult_pippenger_batch
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,
              size_t n_points,size_t cb_offset)

{
  int iVar1;
  int iVar2;
  secp256k1_scratch *psVar3;
  void *__dest;
  undefined8 *puVar4;
  long *plVar5;
  void *pvVar6;
  undefined8 *in_RCX;
  code *in_R8;
  undefined8 in_R9;
  secp256k1_scalar *in_stack_00000008;
  long in_stack_00000010;
  int bucket_window;
  int j;
  int i;
  size_t point_idx;
  size_t idx;
  secp256k1_pippenger_state *state_space;
  secp256k1_gej *buckets;
  secp256k1_scalar *scalars;
  secp256k1_ge *points;
  size_t entries;
  size_t scratch_checkpoint;
  secp256k1_scratch *in_stack_ffffffffffffff58;
  secp256k1_callback *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  secp256k1_scratch *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int iVar7;
  undefined4 in_stack_ffffffffffffff84;
  secp256k1_scalar *s2;
  secp256k1_scratch *scratch_00;
  uchar *puVar8;
  int local_4;
  
  secp256k1_scratch_checkpoint
            ((secp256k1_callback *)in_stack_ffffffffffffff58,(secp256k1_scratch *)0x13a006);
  psVar3 = (secp256k1_scratch *)((long)in_stack_00000008 * 2 + 2);
  scratch_00 = (secp256k1_scratch *)0x0;
  s2 = (secp256k1_scalar *)0x0;
  secp256k1_gej_set_infinity((secp256k1_gej *)0x13a03e);
  if ((in_RCX == (undefined8 *)0x0) && (in_stack_00000008 == (secp256k1_scalar *)0x0)) {
    local_4 = 1;
  }
  else {
    iVar1 = secp256k1_pippenger_bucket_window((size_t)in_stack_00000008);
    __dest = secp256k1_scratch_alloc
                       ((secp256k1_callback *)CONCAT44(iVar1,in_stack_ffffffffffffff78),
                        in_stack_ffffffffffffff70,
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    puVar4 = (undefined8 *)
             secp256k1_scratch_alloc
                       ((secp256k1_callback *)CONCAT44(iVar1,in_stack_ffffffffffffff78),
                        in_stack_ffffffffffffff70,
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    plVar5 = (long *)secp256k1_scratch_alloc
                               ((secp256k1_callback *)CONCAT44(iVar1,in_stack_ffffffffffffff78),
                                in_stack_ffffffffffffff70,
                                CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if ((__dest == (void *)0x0) || ((puVar4 == (undefined8 *)0x0 || (plVar5 == (long *)0x0)))) {
      secp256k1_scratch_apply_checkpoint
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x13a109);
      local_4 = 0;
    }
    else {
      pvVar6 = secp256k1_scratch_alloc
                         ((secp256k1_callback *)CONCAT44(iVar1,in_stack_ffffffffffffff78),
                          in_stack_ffffffffffffff70,
                          CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      plVar5[1] = (long)pvVar6;
      pvVar6 = secp256k1_scratch_alloc
                         ((secp256k1_callback *)CONCAT44(iVar1,in_stack_ffffffffffffff78),psVar3,
                          CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      *plVar5 = (long)pvVar6;
      pvVar6 = secp256k1_scratch_alloc
                         ((secp256k1_callback *)CONCAT44(iVar1,in_stack_ffffffffffffff78),psVar3,
                          CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      if (((plVar5[1] == 0) || (*plVar5 == 0)) || (pvVar6 == (void *)0x0)) {
        secp256k1_scratch_apply_checkpoint
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x13a1f3);
        local_4 = 0;
      }
      else {
        if (in_RCX != (undefined8 *)0x0) {
          *puVar4 = *in_RCX;
          puVar4[1] = in_RCX[1];
          puVar4[2] = in_RCX[2];
          puVar4[3] = in_RCX[3];
          memcpy(__dest,&secp256k1_ge_const_g,0x58);
          puVar8 = scratch_00->magic + 1;
          secp256k1_ecmult_endo_split
                    ((secp256k1_scalar *)puVar8,s2,
                     (secp256k1_ge *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (secp256k1_ge *)CONCAT44(iVar1,in_stack_ffffffffffffff78));
          scratch_00 = (secp256k1_scratch *)(puVar8 + 1);
        }
        for (; s2 < in_stack_00000008; s2 = (secp256k1_scalar *)((long)s2->d + 1)) {
          iVar2 = (*in_R8)(puVar4 + (long)scratch_00 * 4,
                           (void *)((long)__dest + (long)scratch_00 * 0x58),
                           (long)s2->d + in_stack_00000010,in_R9);
          if (iVar2 == 0) {
            secp256k1_scratch_apply_checkpoint
                      (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x13a2f8);
            return 0;
          }
          puVar8 = scratch_00->magic + 1;
          secp256k1_ecmult_endo_split
                    ((secp256k1_scalar *)puVar8,s2,
                     (secp256k1_ge *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (secp256k1_ge *)CONCAT44(iVar1,in_stack_ffffffffffffff78));
          scratch_00 = (secp256k1_scratch *)(puVar8 + 1);
        }
        psVar3 = scratch_00;
        secp256k1_ecmult_pippenger_wnaf
                  ((secp256k1_gej *)error_callback,scratch._4_4_,(secp256k1_pippenger_state *)r,
                   (secp256k1_gej *)inp_g_sc,(secp256k1_scalar *)cb,(secp256k1_ge *)cbdata,n_points)
        ;
        for (iVar2 = 0; (secp256k1_scratch *)(long)iVar2 < psVar3; iVar2 = iVar2 + 1) {
          secp256k1_scalar_clear((secp256k1_scalar *)(puVar4 + (long)iVar2 * 4));
          *(undefined4 *)(plVar5[1] + (long)iVar2 * 0x10) = 0;
          for (iVar7 = 0; iVar7 < (int)(0x7f / (long)(iVar1 + 1)) + 1; iVar7 = iVar7 + 1) {
            in_stack_ffffffffffffff60 = (secp256k1_callback *)*plVar5;
            *(undefined4 *)
             ((long)&in_stack_ffffffffffffff60->fn +
             (long)(iVar2 * ((int)(0x7f / (long)(iVar1 + 1)) + 1) + iVar7) * 4) = 0;
          }
        }
        for (iVar2 = 0; iVar2 < 1 << ((byte)iVar1 & 0x1f); iVar2 = iVar2 + 1) {
          secp256k1_gej_clear((secp256k1_gej *)0x13a4b5);
        }
        secp256k1_scratch_apply_checkpoint(in_stack_ffffffffffffff60,scratch_00,0x13a4dc);
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

static int secp256k1_ecmult_pippenger_batch(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points, size_t cb_offset) {
    const size_t scratch_checkpoint = secp256k1_scratch_checkpoint(error_callback, scratch);
    /* Use 2(n+1) with the endomorphism, when calculating batch
     * sizes. The reason for +1 is that we add the G scalar to the list of
     * other scalars. */
    size_t entries = 2*n_points + 2;
    secp256k1_ge *points;
    secp256k1_scalar *scalars;
    secp256k1_gej *buckets;
    struct secp256k1_pippenger_state *state_space;
    size_t idx = 0;
    size_t point_idx = 0;
    int i, j;
    int bucket_window;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n_points == 0) {
        return 1;
    }
    bucket_window = secp256k1_pippenger_bucket_window(n_points);

    /* We allocate PIPPENGER_SCRATCH_OBJECTS objects on the scratch space. If
     * these allocations change, make sure to update the
     * PIPPENGER_SCRATCH_OBJECTS constant and pippenger_scratch_size
     * accordingly. */
    points = (secp256k1_ge *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*points));
    scalars = (secp256k1_scalar *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*scalars));
    state_space = (struct secp256k1_pippenger_state *) secp256k1_scratch_alloc(error_callback, scratch, sizeof(*state_space));
    if (points == NULL || scalars == NULL || state_space == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }
    state_space->ps = (struct secp256k1_pippenger_point_state *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*state_space->ps));
    state_space->wnaf_na = (int *) secp256k1_scratch_alloc(error_callback, scratch, entries*(WNAF_SIZE(bucket_window+1)) * sizeof(int));
    buckets = (secp256k1_gej *) secp256k1_scratch_alloc(error_callback, scratch, ((size_t)1 << bucket_window) * sizeof(*buckets));
    if (state_space->ps == NULL || state_space->wnaf_na == NULL || buckets == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }

    if (inp_g_sc != NULL) {
        scalars[0] = *inp_g_sc;
        points[0] = secp256k1_ge_const_g;
        idx++;
        secp256k1_ecmult_endo_split(&scalars[0], &scalars[1], &points[0], &points[1]);
        idx++;
    }

    while (point_idx < n_points) {
        if (!cb(&scalars[idx], &points[idx], point_idx + cb_offset, cbdata)) {
            secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
            return 0;
        }
        idx++;
        secp256k1_ecmult_endo_split(&scalars[idx - 1], &scalars[idx], &points[idx - 1], &points[idx]);
        idx++;
        point_idx++;
    }

    secp256k1_ecmult_pippenger_wnaf(buckets, bucket_window, state_space, r, scalars, points, idx);

    /* Clear data */
    for(i = 0; (size_t)i < idx; i++) {
        secp256k1_scalar_clear(&scalars[i]);
        state_space->ps[i].skew_na = 0;
        for(j = 0; j < WNAF_SIZE(bucket_window+1); j++) {
            state_space->wnaf_na[i * WNAF_SIZE(bucket_window+1) + j] = 0;
        }
    }
    for(i = 0; i < 1<<bucket_window; i++) {
        secp256k1_gej_clear(&buckets[i]);
    }
    secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
    return 1;
}